

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O3

void __thiscall
sf::Shader::UniformBinder::UniformBinder(UniformBinder *this,Shader *shader,string *name)

{
  uint uVar1;
  GLhandleARB GVar2;
  int iVar3;
  
  GlResource::TransientContextLock::TransientContextLock(&this->lock);
  this->savedProgram = 0;
  uVar1 = shader->m_shaderProgram;
  this->currentProgram = uVar1;
  this->location = -1;
  if (uVar1 != 0) {
    GVar2 = (*sf_ptrc_glGetHandleARB)(0x8b40);
    this->savedProgram = GVar2;
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Shader.cpp"
                       ,0xc2,"savedProgram = GLEXT_glGetHandle(GLEXT_GL_PROGRAM_OBJECT)");
    if (this->currentProgram != this->savedProgram) {
      (*sf_ptrc_glUseProgramObjectARB)(this->currentProgram);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Shader.cpp"
                         ,0xc4,"GLEXT_glUseProgramObject(currentProgram)");
    }
    iVar3 = getUniformLocation(shader,name);
    this->location = iVar3;
  }
  return;
}

Assistant:

UniformBinder(Shader& shader, const std::string& name) :
    savedProgram(0),
    currentProgram(castToGlHandle(shader.m_shaderProgram)),
    location(-1)
    {
        if (currentProgram)
        {
            // Enable program object
            glCheck(savedProgram = GLEXT_glGetHandle(GLEXT_GL_PROGRAM_OBJECT));
            if (currentProgram != savedProgram)
                glCheck(GLEXT_glUseProgramObject(currentProgram));

            // Store uniform location for further use outside constructor
            location = shader.getUniformLocation(name);
        }
    }